

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::Massacre(AActor *this)

{
  bool bVar1;
  TFlags<ActorFlag2,_unsigned_int> local_40;
  TFlags<ActorFlag,_unsigned_int> local_3c;
  TAngle<double> local_38;
  FName local_30;
  undefined1 local_2c [4];
  TFlags<ActorFlag2,_unsigned_int> local_28;
  TFlags<ActorFlag2,_unsigned_int> local_24;
  TFlags<ActorFlag,_unsigned_int> local_20;
  ActorFlags2 f2;
  ActorFlags f;
  int prevhealth;
  AActor *this_local;
  
  if (this->health < 1) {
    this_local._7_1_ = false;
  }
  else {
    TFlags<ActorFlag,_unsigned_int>::TFlags(&local_20,&this->flags);
    TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_24,&this->flags2);
    TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_SHOOTABLE);
    ::operator|((EnumType)local_2c,MF2_DORMANT);
    TFlags<ActorFlag2,_unsigned_int>::operator~(&local_28);
    TFlags<ActorFlag2,_unsigned_int>::operator&=(&this->flags2,&local_28);
    do {
      f2.Value = this->health;
      FName::FName(&local_30,NAME_Massacre);
      TAngle<double>::TAngle(&local_38,0.0);
      P_DamageMobj(this,(AActor *)0x0,(AActor *)0x0,1000000,&local_30,0,&local_38);
      bVar1 = false;
      if (this->health != f2.Value) {
        bVar1 = 0 < this->health;
      }
    } while (bVar1);
    if (0 < this->health) {
      TFlags<ActorFlag,_unsigned_int>::TFlags(&local_3c,&local_20);
      TFlags<ActorFlag,_unsigned_int>::operator=(&this->flags,&local_3c);
      TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_40,&local_24);
      TFlags<ActorFlag2,_unsigned_int>::operator=(&this->flags2,&local_40);
    }
    this_local._7_1_ = this->health < 1;
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::Massacre ()
{
	int prevhealth;

	if (health > 0)
	{
		auto f = flags;
		auto f2 = flags2;

		flags |= MF_SHOOTABLE;
		flags2 &= ~(MF2_DORMANT|MF2_INVULNERABLE);
		do
		{
			prevhealth = health;
			P_DamageMobj (this, NULL, NULL, TELEFRAG_DAMAGE, NAME_Massacre);
		}
		while (health != prevhealth && health > 0);	//abort if the actor wasn't hurt.
		if (health > 0)
		{
			// restore flags if this did not kill the monster.
			flags = f;
			flags2 = f2;
		}
		return health <= 0;
	}
	return false;
}